

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O2

Abc_Cex_t * Saig_ManExtendCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  byte bVar2;
  Abc_Cex_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  
  pAVar3 = Abc_CexAlloc(0,pAig->nObjs[2],p->iFrame + 1);
  iVar10 = p->iFrame;
  pAVar3->iPo = p->iPo;
  pAVar3->iFrame = iVar10;
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  uVar12 = 0;
  while (iVar10 = (int)uVar12, iVar10 < pAig->nRegs) {
    pvVar4 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar10);
    *(ulong *)((long)pvVar4 + 0x18) =
         *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
         (ulong)(((uint)(&p[1].iPo)[uVar12 >> 5] >> ((byte)uVar12 & 0x1f) & 1) << 5);
    uVar12 = (ulong)(iVar10 + 1);
  }
  iVar10 = 0;
  do {
    iVar9 = (int)uVar12;
    if (p->iFrame < iVar10) {
LAB_0058d151:
      if (iVar9 == p->nBits) {
        pAVar5 = Aig_ManCo(pAig,p->iPo);
        bVar2 = pAVar5->field_0x18;
        Aig_ManCleanMarkB(pAig);
        if ((bVar2 & 0x20) == 0) {
          puts("Saig_ManExtendCex(): The counter-example is invalid!!!");
        }
        return pAVar3;
      }
      __assert_fail("iBit == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x1a1,"Abc_Cex_t *Saig_ManExtendCex(Aig_Man_t *, Abc_Cex_t *)");
    }
    for (i = 0; uVar11 = iVar9 + i, i < pAig->nTruePis; i = i + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,i);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[(int)uVar11 >> 5] >> ((byte)uVar11 & 0x1f) & 1) << 5);
    }
    for (iVar8 = 0; iVar8 < pAig->vCis->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar8);
      if ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0) {
        iVar7 = pAig->nObjs[2] * iVar10 + iVar8;
        (&pAVar3[1].iPo)[iVar7 >> 5] = (&pAVar3[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
      }
    }
    for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vObjs,iVar8);
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar4 + 0x18) =
             *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
             (ulong)((((uint)*(ulong *)((long)pvVar4 + 0x10) ^
                      *(uint *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 5)
                      & ((uint)*(ulong *)((long)pvVar4 + 8) ^
                        *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18) >> 5)
                     & 1) << 5);
      }
    }
    for (iVar8 = 0; iVar8 < pAig->vCos->nSize; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCos,iVar8);
      *(ulong *)((long)pvVar4 + 0x18) =
           *(ulong *)((long)pvVar4 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((int)*(ulong *)((long)pvVar4 + 8) << 5 ^
                   *(uint *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
    }
    if (iVar10 == p->iFrame) {
      iVar9 = iVar9 + i;
      goto LAB_0058d151;
    }
    for (iVar9 = 0; iVar9 < pAig->nRegs; iVar9 = iVar9 + 1) {
      pAVar5 = Saig_ManLi(pAig,iVar9);
      pAVar6 = Saig_ManLo(pAig,iVar9);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)*(undefined8 *)&pAVar5->field_0x18 & 0x20);
    }
    iVar10 = iVar10 + 1;
    uVar12 = (ulong)uVar11;
  } while( true );
}

Assistant:

Abc_Cex_t * Saig_ManExtendCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Abc_Cex_t * pNew;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    // create new counter-example
    pNew = Abc_CexAlloc( 0, Aig_ManCiNum(pAig), p->iFrame + 1 );
    pNew->iPo = p->iPo;
    pNew->iFrame = p->iFrame;
    // simulate the AIG
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        ///////// write PI+LO values ////////////
        Aig_ManForEachCi( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit(pNew->pData, Aig_ManCiNum(pAig)*i + k);
        /////////////////////////////////////////
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    if ( RetValue == 0 )
        printf( "Saig_ManExtendCex(): The counter-example is invalid!!!\n" );
    return pNew;
}